

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

string * Catch::trim(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  size_type end;
  size_type start;
  string *str_local;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)str,(ulong)trim::whitespaceChars);
  std::__cxx11::string::find_last_not_of((char *)str,(ulong)trim::whitespaceChars);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim( std::string const& str ) {
        static char const* whitespaceChars = "\n\r\t ";
        std::string::size_type start = str.find_first_not_of( whitespaceChars );
        std::string::size_type end = str.find_last_not_of( whitespaceChars );

        return start != std::string::npos ? str.substr( start, 1+end-start ) : std::string();
    }